

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

bool __thiscall DataRefs::NeedNewVerCheck(DataRefs *this)

{
  long lVar1;
  
  if (this->lastCheckNewVer != 0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    return 0x30 < (int)(lVar1 / 3600000000000) - this->lastCheckNewVer;
  }
  return true;
}

Assistant:

bool DataRefs::NeedNewVerCheck () const
{
    if (!lastCheckNewVer)
        return true;
    
    // 'now' in hours since the epoch
    int nowH = (int)std::chrono::duration_cast<std::chrono::hours>
    (std::chrono::system_clock::now().time_since_epoch()).count();
    
    return nowH - lastCheckNewVer > LT_NEW_VER_CHECK_TIME;
}